

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl_lite.cc
# Opt level: O0

void __thiscall
google::protobuf::io::CopyingOutputStreamAdaptor::BackUp(CopyingOutputStreamAdaptor *this,int count)

{
  LogMessage *other;
  int in_ESI;
  long in_RDI;
  LogMessage *in_stack_fffffffffffffed8;
  LogMessage *in_stack_fffffffffffffee0;
  LogMessage *this_00;
  undefined8 in_stack_fffffffffffffee8;
  LogLevel_conflict level;
  LogMessage *in_stack_fffffffffffffef0;
  LogMessage local_d8;
  byte local_99;
  byte local_49;
  int local_c;
  
  level = (LogLevel_conflict)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  local_49 = 0;
  local_c = in_ESI;
  if (in_ESI < 0) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_49 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if ((local_49 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x3de50b);
  }
  local_99 = 0;
  if (*(int *)(in_RDI + 0x2c) != *(int *)(in_RDI + 0x28)) {
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)in_stack_fffffffffffffee0,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    local_99 = 1;
    internal::LogMessage::operator<<(in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    in_stack_fffffffffffffef0 =
         internal::LogMessage::operator<<
                   (in_stack_fffffffffffffee0,(char *)in_stack_fffffffffffffed8);
    internal::LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  }
  if ((local_99 & 1) != 0) {
    internal::LogMessage::~LogMessage((LogMessage *)0x3de5ae);
  }
  if (*(int *)(in_RDI + 0x2c) < local_c) {
    this_00 = &local_d8;
    internal::LogMessage::LogMessage
              (in_stack_fffffffffffffef0,level,(char *)this_00,
               (int)((ulong)in_stack_fffffffffffffed8 >> 0x20));
    internal::LogMessage::operator<<(this_00,(char *)in_stack_fffffffffffffed8);
    other = internal::LogMessage::operator<<(this_00,(char *)in_stack_fffffffffffffed8);
    internal::LogFinisher::operator=((LogFinisher *)this_00,other);
    internal::LogMessage::~LogMessage((LogMessage *)0x3de641);
  }
  *(int *)(in_RDI + 0x2c) = *(int *)(in_RDI + 0x2c) - local_c;
  return;
}

Assistant:

void CopyingOutputStreamAdaptor::BackUp(int count) {
  GOOGLE_CHECK_GE(count, 0);
  GOOGLE_CHECK_EQ(buffer_used_, buffer_size_)
      << " BackUp() can only be called after Next().";
  GOOGLE_CHECK_LE(count, buffer_used_)
      << " Can't back up over more bytes than were returned by the last call"
         " to Next().";

  buffer_used_ -= count;
}